

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

char * GetQuote(ConfigScanner *sc)

{
  byte bVar1;
  size_t sVar2;
  char *pcVar3;
  byte *pbVar4;
  char *__dest;
  byte *__src;
  
  if (sc == (ConfigScanner *)0x0) {
    return (char *)0x0;
  }
  __src = (byte *)sc->ptr;
  pbVar4 = __src;
  do {
    bVar1 = *pbVar4;
    if (bVar1 < 0x22) {
      if (bVar1 == 0) {
        return (char *)0x0;
      }
      if (bVar1 == 10) {
        return (char *)0x0;
      }
      if (bVar1 == 0xd) {
        return (char *)0x0;
      }
    }
    else if (bVar1 == 0x5c) {
      sc->ptr = (char *)(pbVar4 + 1);
      bVar1 = pbVar4[1];
      pbVar4 = pbVar4 + 1;
    }
    else if (bVar1 == 0x22) {
      pcVar3 = (char *)calloc(1,(size_t)(pbVar4 + (1 - (long)__src)));
      __dest = pcVar3;
      do {
        bVar1 = *__src;
        if (bVar1 == 0x5c) {
          bVar1 = __src[1];
          __src = __src + 1;
        }
        else if (bVar1 == 0x22) {
          if (*pbVar4 != 0x22) {
            return pcVar3;
          }
          sc->ptr = (char *)(pbVar4 + 1);
          return pcVar3;
        }
        sVar2 = GetUTF8Length(bVar1);
        memcpy(__dest,__src,sVar2);
        __src = __src + sVar2;
        __dest = __dest + sVar2;
      } while( true );
    }
    sVar2 = GetUTF8Length(bVar1);
    if (sVar2 == 0) {
      return (char *)0x0;
    }
    pbVar4 = pbVar4 + sVar2;
    sc->ptr = (char *)pbVar4;
  } while( true );
}

Assistant:

char *GetQuote(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return NULL;
	}
	char *start = sc->ptr;
	while (true)
	{
		char ch = *sc->ptr;
		if ((ch == '\r') || (ch == '\n') || (ch == '\0'))
		{
			return NULL;
		}
		else if (ch == '"')
		{
			break;
		}
		else if (ch == '\\')
		{
			ch = *++sc->ptr;
		}
		size_t step = GetUTF8Length(ch);
		if (step == 0)
		{
			return NULL;
		}
		sc->ptr += step;
	}
	size_t length = sc->ptr - start;
	char *temp = (char *)malloc(length + 1);
	memset(temp, 0, length + 1);
	char *s = start;
	char *d = temp;
	while (true)
	{
		char ch = *s;
		if (ch == '"')
		{
			break;
		}
		else if (ch == '\\')
		{
			ch = *++s;
		}
		size_t step = GetUTF8Length(ch);
		memcpy(d, s, step);
		s += step;
		d += step;
	}
	if (*sc->ptr == '"')
	{
		sc->ptr++;
	}
	return temp;
}